

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O0

bool __thiscall
cmWhileFunctionBlocker::IsFunctionBlocked
          (cmWhileFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  char *pcVar1;
  bool bVar2;
  cmListFileContext *pcVar3;
  ulong uVar4;
  reference pcVar5;
  cmExecutionStatus local_254;
  reference pcStack_250;
  cmExecutionStatus status;
  cmListFileFunction *fn;
  iterator __end5;
  iterator __begin5;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *__range5;
  cmListFileArgument *arg;
  iterator __end6;
  iterator __begin6;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *__range6;
  undefined1 local_208 [8];
  string err;
  undefined1 local_1e0 [7];
  bool isTrue;
  cmListFileContext local_1d0;
  undefined1 local_188 [8];
  cmConditionEvaluator conditionEvaluator;
  cmCommandContext commandContext;
  cmListFileContext execContext;
  MessageType messageType;
  undefined1 local_78 [8];
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  string errorString;
  unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> fb;
  cmExecutionStatus *inStatus_local;
  cmMakefile *mf_local;
  cmListFileFunction *lff_local;
  cmWhileFunctionBlocker *this_local;
  
  fb._M_t.super___uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>._M_t.
  super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
  super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>,_true,_true>)
       (__uniq_ptr_data<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>,_true,_true>)
       inStatus;
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lff,
                          "while");
  if (bVar2) {
    this->Depth = this->Depth + 1;
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lff
                            ,"endwhile");
    if (bVar2) {
      if (this->Depth == 0) {
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)&stack0xffffffffffffffc8,(cmFunctionBlocker *)mf,
                   (cmListFileFunction *)this);
        bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stack0xffffffffffffffc8);
        if (bVar2) {
          std::__cxx11::string::string
                    ((string *)
                     &expandedArguments.
                      super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::vector
                    ((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      *)local_78);
          cmMakefile::ExpandArguments
                    (mf,&this->Args,
                     (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      *)local_78,(char *)0x0);
          pcVar3 = cmFunctionBlocker::GetStartingContext(&this->super_cmFunctionBlocker);
          cmListFileContext::cmListFileContext((cmListFileContext *)&commandContext.Line,pcVar3);
          cmCommandContext::cmCommandContext((cmCommandContext *)&conditionEvaluator.Policy57Status)
          ;
          commandContext.Name.Original.field_2._8_8_ = execContext.FilePath.field_2._8_8_;
          cmCommandContext::cmCommandName::operator=
                    ((cmCommandName *)&conditionEvaluator.Policy57Status,
                     (string *)&commandContext.Line);
          pcVar3 = cmFunctionBlocker::GetStartingContext(&this->super_cmFunctionBlocker);
          cmListFileContext::cmListFileContext(&local_1d0,pcVar3);
          cmMakefile::GetBacktrace((cmMakefile *)local_1e0,(cmCommandContext *)mf);
          cmConditionEvaluator::cmConditionEvaluator
                    ((cmConditionEvaluator *)local_188,mf,&local_1d0,
                     (cmListFileBacktrace *)local_1e0);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1e0);
          cmListFileContext::~cmListFileContext(&local_1d0);
          err.field_2._M_local_buf[0xf] =
               cmConditionEvaluator::IsTrue
                         ((cmConditionEvaluator *)local_188,
                          (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                           *)local_78,
                          (string *)
                          &expandedArguments.
                           super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (MessageType *)&execContext.Line);
          while (err.field_2._M_local_buf[0xf] != '\0') {
            uVar4 = std::__cxx11::string::empty();
            if ((uVar4 & 1) == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_208,"had incorrect arguments: ",
                         (allocator<char> *)((long)&__range6 + 7));
              std::allocator<char>::~allocator((allocator<char> *)((long)&__range6 + 7));
              __end6 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::begin
                                 (&this->Args);
              arg = (cmListFileArgument *)
                    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::end
                              (&this->Args);
              while (bVar2 = __gnu_cxx::operator!=
                                       (&__end6,(__normal_iterator<cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                                                 *)&arg), bVar2) {
                pcVar5 = __gnu_cxx::
                         __normal_iterator<cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                         ::operator*(&__end6);
                pcVar1 = "PK\x01\x02";
                if (pcVar5->Delim != Unquoted) {
                  pcVar1 = "\n\t\t\t\"";
                }
                std::__cxx11::string::operator+=((string *)local_208,pcVar1 + 4);
                std::__cxx11::string::operator+=((string *)local_208,(string *)pcVar5);
                pcVar1 = "PK\x01\x02";
                if (pcVar5->Delim != Unquoted) {
                  pcVar1 = "\n\t\t\t\"";
                }
                std::__cxx11::string::operator+=((string *)local_208,pcVar1 + 4);
                std::__cxx11::string::operator+=((string *)local_208," ");
                __gnu_cxx::
                __normal_iterator<cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                ::operator++(&__end6);
              }
              std::__cxx11::string::operator+=((string *)local_208,"(");
              std::__cxx11::string::operator+=
                        ((string *)local_208,
                         (string *)
                         &expandedArguments.
                          super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::string::operator+=((string *)local_208,").");
              cmMakefile::IssueMessage(mf,(MessageType)execContext.Line,(string *)local_208);
              bVar2 = (MessageType)execContext.Line == FATAL_ERROR;
              if (bVar2) {
                cmSystemTools::SetFatalErrorOccured();
                this_local._7_1_ = 1;
              }
              std::__cxx11::string::~string((string *)local_208);
              if (bVar2) goto LAB_004690ab;
            }
            __end5 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                               (&this->Functions);
            fn = (cmListFileFunction *)
                 std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                           (&this->Functions);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end5,(__normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                                               *)&fn), bVar2) {
              pcStack_250 = __gnu_cxx::
                            __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                            ::operator*(&__end5);
              cmExecutionStatus::cmExecutionStatus(&local_254);
              cmMakefile::ExecuteCommand(mf,pcStack_250,&local_254);
              bVar2 = cmExecutionStatus::GetReturnInvoked(&local_254);
              if (bVar2) {
                cmExecutionStatus::SetReturnInvoked
                          ((cmExecutionStatus *)
                           fb._M_t.
                           super___uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                           .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl);
                this_local._7_1_ = 1;
                goto LAB_004690ab;
              }
              bVar2 = cmExecutionStatus::GetBreakInvoked(&local_254);
              if (bVar2) {
                this_local._7_1_ = 1;
                goto LAB_004690ab;
              }
              bVar2 = cmExecutionStatus::GetContinueInvoked(&local_254);
              if (bVar2) break;
              bVar2 = cmSystemTools::GetFatalErrorOccured();
              if (bVar2) {
                this_local._7_1_ = 1;
                goto LAB_004690ab;
              }
              __gnu_cxx::
              __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
              ::operator++(&__end5);
            }
            std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
            clear((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                  local_78);
            cmMakefile::ExpandArguments
                      (mf,&this->Args,
                       (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                        *)local_78,(char *)0x0);
            err.field_2._M_local_buf[0xf] =
                 cmConditionEvaluator::IsTrue
                           ((cmConditionEvaluator *)local_188,
                            (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                             *)local_78,
                            (string *)
                            &expandedArguments.
                             super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (MessageType *)&execContext.Line);
          }
          this_local._7_1_ = 1;
LAB_004690ab:
          cmConditionEvaluator::~cmConditionEvaluator((cmConditionEvaluator *)local_188);
          cmCommandContext::~cmCommandContext
                    ((cmCommandContext *)&conditionEvaluator.Policy57Status);
          cmListFileContext::~cmListFileContext((cmListFileContext *)&commandContext.Line);
          std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
          ~vector((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                  local_78);
          std::__cxx11::string::~string
                    ((string *)
                     &expandedArguments.
                      super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          this_local._7_1_ = 0;
        }
        std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>::~unique_ptr
                  ((unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *)
                   &stack0xffffffffffffffc8);
        goto LAB_0046915f;
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  this_local._7_1_ = 1;
LAB_0046915f:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmWhileFunctionBlocker::IsFunctionBlocked(const cmListFileFunction& lff,
                                               cmMakefile& mf,
                                               cmExecutionStatus& inStatus)
{
  // at end of for each execute recorded commands
  if (lff.Name.Lower == "while") {
    // record the number of while commands past this one
    this->Depth++;
  } else if (lff.Name.Lower == "endwhile") {
    // if this is the endwhile for this while loop then execute
    if (!this->Depth) {
      // Remove the function blocker for this scope or bail.
      std::unique_ptr<cmFunctionBlocker> fb(
        mf.RemoveFunctionBlocker(this, lff));
      if (!fb) {
        return false;
      }

      std::string errorString;

      std::vector<cmExpandedCommandArgument> expandedArguments;
      mf.ExpandArguments(this->Args, expandedArguments);
      MessageType messageType;

      cmListFileContext execContext = this->GetStartingContext();

      cmCommandContext commandContext;
      commandContext.Line = execContext.Line;
      commandContext.Name = execContext.Name;

      cmConditionEvaluator conditionEvaluator(mf, this->GetStartingContext(),
                                              mf.GetBacktrace(commandContext));

      bool isTrue =
        conditionEvaluator.IsTrue(expandedArguments, errorString, messageType);

      while (isTrue) {
        if (!errorString.empty()) {
          std::string err = "had incorrect arguments: ";
          for (cmListFileArgument const& arg : this->Args) {
            err += (arg.Delim ? "\"" : "");
            err += arg.Value;
            err += (arg.Delim ? "\"" : "");
            err += " ";
          }
          err += "(";
          err += errorString;
          err += ").";
          mf.IssueMessage(messageType, err);
          if (messageType == MessageType::FATAL_ERROR) {
            cmSystemTools::SetFatalErrorOccured();
            return true;
          }
        }

        // Invoke all the functions that were collected in the block.
        for (cmListFileFunction const& fn : this->Functions) {
          cmExecutionStatus status;
          mf.ExecuteCommand(fn, status);
          if (status.GetReturnInvoked()) {
            inStatus.SetReturnInvoked();
            return true;
          }
          if (status.GetBreakInvoked()) {
            return true;
          }
          if (status.GetContinueInvoked()) {
            break;
          }
          if (cmSystemTools::GetFatalErrorOccured()) {
            return true;
          }
        }
        expandedArguments.clear();
        mf.ExpandArguments(this->Args, expandedArguments);
        isTrue = conditionEvaluator.IsTrue(expandedArguments, errorString,
                                           messageType);
      }
      return true;
    }
    // decrement for each nested while that ends
    this->Depth--;
  }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}